

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O3

bool __thiscall
unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::remove_internal
          (db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this,
          art_key_type k)

{
  key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
  kVar1;
  uint uVar2;
  int iVar3;
  void *in_RDX;
  ulong uVar4;
  basic_node_ptr<unodb::detail::node_header> this_00;
  key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
  *this_01;
  optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> oVar5;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 local_50;
  art_key_type k_local;
  node_ptr *node;
  byte local_31;
  
  this_00.tagged_ptr = (this->root).tagged_ptr;
  if ((basic_leaf<unsigned_long,_unodb::detail::node_header> *)this_00.tagged_ptr !=
      (basic_leaf<unsigned_long,_unodb::detail::node_header> *)0x0) {
    local_50 = k.field_0;
    k_local.field_0 = (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)this;
    if ((this_00.tagged_ptr & 7) == 0) {
      iVar3 = detail::basic_leaf<unsigned_long,_unodb::detail::node_header>::cmp
                        ((basic_leaf<unsigned_long,_unodb::detail::node_header> *)this_00.tagged_ptr
                         ,(void *)k.field_0,in_RDX);
      if (iVar3 == 0) {
        (this->root).tagged_ptr = 0;
        std::
        unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
        ::~unique_ptr((unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                       *)&k_local);
        return true;
      }
    }
    else {
      while( true ) {
        if ((this_00.tagged_ptr & 7) == 0) {
          __assert_fail("node_type != node_type::LEAF",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                        ,0x3f9,
                        "bool unodb::db<unsigned long, std::span<const std::byte>>::remove_internal(art_key_type) [Key = unsigned long, Value = std::span<const std::byte>]"
                       );
        }
        this_01 = (key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                   *)(this_00.tagged_ptr & 0xfffffffffffffff8);
        kVar1 = this_01[7];
        if (7 < (byte)kVar1) {
          __assert_fail("result <= key_prefix_capacity",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                        ,0x298,
                        "key_prefix_size unodb::detail::key_prefix<unodb::detail::basic_art_key<unsigned long>, unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::critical_section_policy>::length() const [ArtKey = unodb::detail::basic_art_key<unsigned long>, CriticalSectionPolicy = unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::critical_section_policy]"
                       );
        }
        uVar2 = detail::
                key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                ::get_shared_length(this_01,(uint64_t)k.field_0);
        if (uVar2 < (byte)kVar1) break;
        if (uVar2 != (byte)kVar1) {
          __assert_fail("shared_prefix_len == key_prefix_length",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                        ,0x401,
                        "bool unodb::db<unsigned long, std::span<const std::byte>>::remove_internal(art_key_type) [Key = unsigned long, Value = std::span<const std::byte>]"
                       );
        }
        uVar4 = (ulong)k.field_0 >> (((byte)kVar1 & 7) << 3);
        local_31 = (byte)uVar4;
        oVar5 = detail::
                basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>>
                ::
                remove_or_choose_subtree<std::optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>*>,std::byte,unodb::detail::basic_art_key<unsigned_long>&,unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>&,unodb::detail::basic_node_ptr<unodb::detail::node_header>*&>
                          ((basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>>
                            *)this_01,(node_type)this_00.tagged_ptr & (I256|I48),&local_31,
                           (basic_art_key<unsigned_long> *)&local_50.key_bytes,this,
                           (basic_node_ptr<unodb::detail::node_header> **)&k_local);
        k_local.field_0.key =
             oVar5.
             super__Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>
             ._M_payload.
             super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>
             ._M_payload;
        if (((undefined1  [16])
             oVar5.
             super__Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>
             ._M_payload.
             super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>
            & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
        if (k_local.field_0.key == (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)0x0)
        {
          return true;
        }
        k.field_0 = (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)(uVar4 >> 8);
        this_00.tagged_ptr = *(uintptr_t *)k_local.field_0;
      }
    }
  }
  return false;
}

Assistant:

bool db<Key, Value>::remove_internal(art_key_type k) {
  if (UNODB_DETAIL_UNLIKELY(root == nullptr)) return false;

  if (root.type() == node_type::LEAF) {
    auto* const root_leaf{root.ptr<leaf_type*>()};
    if (root_leaf->matches(k)) {
      const auto r{art_policy::reclaim_leaf_on_scope_exit(root_leaf, *this)};
      root = nullptr;
      return true;
    }
    return false;
  }

  auto* node = &root;
  tree_depth_type depth{};
  auto remaining_key{k};

  while (true) {
    const auto node_type = node->type();
    UNODB_DETAIL_ASSERT(node_type != node_type::LEAF);

    auto* const inode{node->template ptr<inode_type*>()};
    const auto& key_prefix{inode->get_key_prefix()};
    const auto key_prefix_length{key_prefix.length()};
    const auto shared_prefix_len{key_prefix.get_shared_length(remaining_key)};
    if (shared_prefix_len < key_prefix_length) return false;

    UNODB_DETAIL_ASSERT(shared_prefix_len == key_prefix_length);
    depth += key_prefix_length;
    remaining_key.shift_right(key_prefix_length);

    const auto remove_result{inode->template remove_or_choose_subtree<
        std::optional<detail::node_ptr*>>(node_type, remaining_key[0], k, *this,
                                          node)};
    if (UNODB_DETAIL_UNLIKELY(!remove_result)) return false;

    auto* const child_ptr{*remove_result};
    if (child_ptr == nullptr) return true;

    node = child_ptr;
    ++depth;
    remaining_key.shift_right(1);
  }
}